

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  string f_file;
  string q_file;
  Graph *this;
  invalid_argument *this_00;
  long lVar1;
  long *plVar2;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  int treshhold;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  file_names;
  int quality;
  undefined8 in_stack_fffffffffffffde8;
  int t;
  int iVar3;
  undefined4 uVar4;
  char *pcVar5;
  undefined1 *puVar6;
  undefined8 in_stack_fffffffffffffe08;
  long in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  long local_1d0 [2];
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c0;
  _Tuple_impl<0UL,_const_char_*,_const_char_*> local_1a8;
  _Tuple_impl<0UL,_const_char_*,_const_char_*> local_198;
  _Tuple_impl<0UL,_const_char_*,_const_char_*> local_188;
  _Tuple_impl<0UL,_const_char_*,_const_char_*> local_178;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> local_128 [64];
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> local_e8 [64];
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> local_a8 [64];
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> local_68 [48];
  long local_38 [2];
  
  t = 0x10603c;
  uVar4 = 0;
  pcVar5 = "sample1.fasta";
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const*,char_const*>
            ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)&local_168,
             (_Tuple_impl<0UL,_const_char_*,_const_char_*> *)&stack0xfffffffffffffdf0);
  local_178.super__Tuple_impl<1UL,_const_char_*>.super__Head_base<1UL,_const_char_*,_false>.
  _M_head_impl = (_Head_base<1UL,_const_char_*,_false>)"qualities2.qual";
  local_178.super__Head_base<0UL,_const_char_*,_false>._M_head_impl = "sample2.fasta";
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const*,char_const*>(local_128,&local_178);
  local_188.super__Tuple_impl<1UL,_const_char_*>.super__Head_base<1UL,_const_char_*,_false>.
  _M_head_impl = (_Head_base<1UL,_const_char_*,_false>)"qualities3.qual";
  local_188.super__Head_base<0UL,_const_char_*,_false>._M_head_impl = "sample3.fasta";
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const*,char_const*>(local_e8,&local_188);
  local_198.super__Tuple_impl<1UL,_const_char_*>.super__Head_base<1UL,_const_char_*,_false>.
  _M_head_impl = (_Head_base<1UL,_const_char_*,_false>)"qualities4.qual";
  local_198.super__Head_base<0UL,_const_char_*,_false>._M_head_impl = "sample4.fasta";
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const*,char_const*>(local_a8,&local_198);
  local_1a8.super__Tuple_impl<1UL,_const_char_*>.super__Head_base<1UL,_const_char_*,_false>.
  _M_head_impl = (_Head_base<1UL,_const_char_*,_false>)"qualities5.qual";
  local_1a8.super__Head_base<0UL,_const_char_*,_false>._M_head_impl = "sample5.fasta";
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const*,char_const*>(local_68,&local_1a8);
  __l._M_len = 5;
  __l._M_array = &local_168;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_1c0,__l,(allocator_type *)&stack0xfffffffffffffdef);
  lVar1 = -0x140;
  plVar2 = local_38;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    if (plVar2 + -4 != (long *)plVar2[-6]) {
      operator_delete((long *)plVar2[-6],plVar2[-4] + 1);
    }
    plVar2 = plVar2 + -8;
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"What treshold [4, 7]?: ",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  std::istream::operator>>((istream *)&std::cin,(int *)&stack0xfffffffffffffdf0);
  if (*(int *)(std::invalid_argument::invalid_argument + *(long *)(std::cin + -0x18)) == 0) {
    if (t - 8U < 0xfffffffc) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Wrong number!");
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"What quality [1, 40]?: ",0x17);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
      std::ostream::put(-0x10);
      std::ostream::flush();
      std::istream::operator>>((istream *)&std::cin,(int *)&local_168);
      if (*(int *)(std::invalid_argument::invalid_argument + *(long *)(std::cin + -0x18)) == 0) {
        if (0xffffffd7 <
            (int)local_168.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl._M_dataplus._M_p - 0x29U) {
          this = (Graph *)operator_new(0x50);
          iVar3 = t;
          plVar2 = local_1d0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffe20,"sample1.fasta","");
          puVar6 = &stack0xfffffffffffffe10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffe00,"qualities1.qual","");
          f_file._M_string_length._0_4_ = iVar3;
          f_file._M_dataplus._M_p = (pointer)in_stack_fffffffffffffde8;
          f_file._M_string_length._4_4_ = uVar4;
          f_file.field_2._M_allocated_capacity = (size_type)pcVar5;
          f_file.field_2._8_8_ = puVar6;
          q_file._M_string_length = in_stack_fffffffffffffe10;
          q_file._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe08;
          q_file.field_2._M_allocated_capacity = in_stack_fffffffffffffe18;
          q_file.field_2._8_8_ = plVar2;
          Graph::Graph(this,t,(int)local_168.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   .
                                   super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   .
                                   super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                   ._M_head_impl._M_dataplus._M_p,f_file,q_file);
          if (puVar6 != &stack0xfffffffffffffe10) {
            operator_delete(puVar6,in_stack_fffffffffffffe10 + 1);
          }
          if (plVar2 != local_1d0) {
            operator_delete(plVar2,local_1d0[0] + 1);
          }
          Graph::alignSequences(this);
          std::vector<Vertex,_std::allocator<Vertex>_>::~vector(&this->vertices);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector(&this->qualities);
          std::
          vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          ::~vector(&this->sequences);
          operator_delete(this,0x50);
          std::
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_1c0);
          return 0;
        }
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_00,"Wrong number!");
      }
      else {
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_00,"Wrong number!");
      }
    }
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Wrong number!");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int main(){
    // every file
    const vector<tuple<string, string> > file_names = {
            make_tuple("sample1.fasta", "qualities1.qual"),
            make_tuple("sample2.fasta", "qualities2.qual"),
            make_tuple("sample3.fasta", "qualities3.qual"),
            make_tuple("sample4.fasta", "qualities4.qual"),
            make_tuple("sample5.fasta", "qualities5.qual")
    };
    int quality, treshhold;
    try{
        cout << "What treshold [4, 7]?: " << endl;
        cin >> treshhold;
        if(not(cin.good())){
            throw invalid_argument("Wrong number!");
        }
        if(treshhold < 4 or treshhold > 7)
            throw invalid_argument("Wrong number!");
        cout << "What quality [1, 40]?: " << endl;\
        cin >> quality;
        if(not(cin.good())){
            throw invalid_argument("Wrong number!");
        }
        if(quality < 1 or quality > 40)
            throw invalid_argument("Wrong number!");
    } catch(exception &e){
        cerr << e.what() << endl;
        exit(EXIT_FAILURE);
    }
    auto *G = new Graph(treshhold, quality, "sample1.fasta", "qualities1.qual");
    G->alignSequences();
    delete G;

    return 0;
}